

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void __thiscall
FRemapTable::AddDesaturation
          (FRemapTable *this,int start,int end,double r1,double g1,double b1,double r2,double g2,
          double b2)

{
  BYTE BVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_5c;
  int cc;
  PalEntry pe;
  double intensity;
  double dStack_48;
  int c;
  double b2_local;
  double g2_local;
  double r2_local;
  double b1_local;
  double g1_local;
  double r1_local;
  int end_local;
  int start_local;
  FRemapTable *this_local;
  
  dStack_48 = b2;
  b2_local = g2;
  g2_local = r2;
  r2_local = b1;
  b1_local = g1;
  g1_local = r1;
  r1_local._0_4_ = end;
  r1_local._4_4_ = start;
  _end_local = this;
  g1_local = clamp<double>(r1,0.0,2.0);
  b1_local = clamp<double>(b1_local,0.0,2.0);
  r2_local = clamp<double>(r2_local,0.0,2.0);
  g2_local = clamp<double>(g2_local,0.0,2.0);
  b2_local = clamp<double>(b2_local,0.0,2.0);
  dStack_48 = clamp<double>(dStack_48,0.0,2.0);
  if (r1_local._0_4_ < r1_local._4_4_) {
    swapvalues<int>((int *)((long)&r1_local + 4),(int *)&r1_local);
    swapvalues<double>(&g1_local,&g2_local);
    swapvalues<double>(&b1_local,&b2_local);
    swapvalues<double>(&r2_local,&stack0xffffffffffffffb8);
  }
  g2_local = g2_local - g1_local;
  b2_local = b2_local - b1_local;
  dStack_48 = dStack_48 - r2_local;
  g1_local = g1_local * 255.0;
  b1_local = b1_local * 255.0;
  r2_local = r2_local * 255.0;
  for (intensity._4_4_ = r1_local._4_4_; intensity._4_4_ <= r1_local._0_4_;
      intensity._4_4_ = intensity._4_4_ + 1) {
    _cc = (double)((uint)GPalette.BaseColors[intensity._4_4_].field_0.field_0.r * 0x4d +
                   (uint)GPalette.BaseColors[intensity._4_4_].field_0.field_0.g * 0x8f +
                  (uint)GPalette.BaseColors[intensity._4_4_].field_0.field_0.b * 0x25) / 256.0;
    iVar2 = MIN<int>(0xff,(int)(g1_local + _cc * g2_local));
    iVar3 = MIN<int>(0xff,(int)(b1_local + _cc * b2_local));
    iVar4 = MIN<int>(0xff,(int)(r2_local + _cc * dStack_48));
    PalEntry::PalEntry((PalEntry *)&local_5c.field_0,(BYTE)iVar2,(BYTE)iVar3,(BYTE)iVar4);
    uVar5 = (uint)GPalette.Remap[intensity._4_4_];
    BVar1 = FColorMatcher::Pick(&ColorMatcher,(PalEntry)local_5c.field_0);
    this->Remap[(int)uVar5] = BVar1;
    this->Palette[(int)uVar5].field_0 = local_5c;
    BVar1 = 0xff;
    if (uVar5 == 0) {
      BVar1 = '\0';
    }
    this->Palette[(int)uVar5].field_0.field_0.a = BVar1;
  }
  return;
}

Assistant:

void FRemapTable::AddDesaturation(int start, int end, double r1, double g1, double b1, double r2, double g2, double b2)
{
	r1 = clamp(r1, 0.0, 2.0);
	g1 = clamp(g1, 0.0, 2.0);
	b1 = clamp(b1, 0.0, 2.0);
	r2 = clamp(r2, 0.0, 2.0);
	g2 = clamp(g2, 0.0, 2.0);
	b2 = clamp(b2, 0.0, 2.0);

	if (start > end)
	{
		swapvalues(start, end);
		swapvalues(r1, r2);
		swapvalues(g1, g2);
		swapvalues(b1, b2);
	}

	r2 -= r1;
	g2 -= g1;
	b2 -= b1;
	r1 *= 255;
	g1 *= 255;
	b1 *= 255;

	for(int c = start; c <= end; c++)
	{
		double intensity = (GPalette.BaseColors[c].r * 77 +
							GPalette.BaseColors[c].g * 143 +
							GPalette.BaseColors[c].b * 37) / 256.0;

		PalEntry pe = PalEntry(	MIN(255, int(r1 + intensity*r2)), 
								MIN(255, int(g1 + intensity*g2)), 
								MIN(255, int(b1 + intensity*b2)));

		int cc = GPalette.Remap[c];

		Remap[cc] = ColorMatcher.Pick(pe);
		Palette[cc] = pe;
		Palette[cc].a = cc == 0 ? 0:255;
	}
}